

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O2

void embree::avx::SphereMiMBIntersectorK<4,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  float fVar1;
  uint uVar2;
  Scene *pSVar3;
  Geometry *pGVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  uint uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  RayHitK<8> *pRVar12;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  float fVar21;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  float fVar32;
  float fVar39;
  float fVar40;
  undefined1 auVar33 [16];
  float fVar41;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<4> hit;
  HitK<8> h;
  undefined1 local_320 [16];
  RayQueryContext *local_308;
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  Primitive *local_2a8;
  undefined1 *local_2a0;
  void *local_298;
  RTCRayQueryContext *local_290;
  RayHitK<8> *local_288;
  undefined1 (*local_280) [32];
  undefined4 local_278;
  undefined1 local_270 [16];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  undefined4 local_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar13;
  undefined1 auVar54 [64];
  undefined1 auVar56 [64];
  undefined1 auVar60 [64];
  
  pSVar3 = context->scene;
  pGVar4 = (pSVar3->geometries).items[sphere->sharedGeomID].ptr;
  fVar1 = (pGVar4->time_range).lower;
  fVar1 = pGVar4->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0xe0) - fVar1) / ((pGVar4->time_range).upper - fVar1));
  auVar43 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
  auVar43 = vminss_avx(auVar43,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
  auVar45 = vmaxss_avx(ZEXT816(0) << 0x20,auVar43);
  uVar13 = (ulong)(sphere->primIDs).field_0.i[0];
  lVar18 = *(long *)&pGVar4[2].numPrimitives;
  lVar14 = (long)(int)auVar45._0_4_ * 0x38;
  lVar5 = *(long *)(lVar18 + lVar14);
  lVar6 = *(long *)(lVar18 + 0x10 + lVar14);
  auVar43 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar13);
  uVar15 = (ulong)(sphere->primIDs).field_0.i[1];
  auVar25 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar15);
  uVar16 = (ulong)(sphere->primIDs).field_0.i[2];
  auVar35 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar16);
  uVar17 = (ulong)(sphere->primIDs).field_0.i[3];
  auVar59 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar17);
  lVar5 = *(long *)(lVar18 + 0x38 + lVar14);
  lVar18 = *(long *)(lVar18 + 0x48 + lVar14);
  auVar67 = *(undefined1 (*) [16])(lVar5 + uVar13 * lVar18);
  auVar42 = *(undefined1 (*) [16])(lVar5 + uVar15 * lVar18);
  auVar22 = *(undefined1 (*) [16])(lVar5 + uVar16 * lVar18);
  auVar44 = *(undefined1 (*) [16])(lVar5 + lVar18 * uVar17);
  fVar1 = fVar1 - auVar45._0_4_;
  auVar45 = vunpcklps_avx(auVar43,auVar35);
  auVar43 = vunpckhps_avx(auVar43,auVar35);
  auVar35 = vunpcklps_avx(auVar25,auVar59);
  auVar25 = vunpckhps_avx(auVar25,auVar59);
  auVar49 = vunpcklps_avx(auVar45,auVar35);
  auVar35 = vunpckhps_avx(auVar45,auVar35);
  auVar45 = vunpcklps_avx(auVar43,auVar25);
  auVar59 = vunpckhps_avx(auVar43,auVar25);
  auVar33 = vunpcklps_avx(auVar67,auVar22);
  auVar43 = vunpckhps_avx(auVar67,auVar22);
  auVar67 = vunpcklps_avx(auVar42,auVar44);
  auVar25 = vunpckhps_avx(auVar42,auVar44);
  auVar22 = vunpcklps_avx(auVar33,auVar67);
  auVar67 = vunpckhps_avx(auVar33,auVar67);
  auVar44 = vunpcklps_avx(auVar43,auVar25);
  auVar42 = vunpckhps_avx(auVar43,auVar25);
  auVar43 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
  auVar25 = vshufps_avx(ZEXT416((uint)(1.0 - fVar1)),ZEXT416((uint)(1.0 - fVar1)),0);
  auVar33._8_4_ = 0x3f800000;
  auVar33._0_8_ = 0x3f8000003f800000;
  auVar33._12_4_ = 0x3f800000;
  fVar1 = auVar43._0_4_;
  fVar7 = auVar43._4_4_;
  fVar8 = auVar43._8_4_;
  fVar31 = auVar43._12_4_;
  fVar21 = auVar25._0_4_;
  fVar29 = auVar25._4_4_;
  fVar30 = auVar25._8_4_;
  fVar32 = auVar25._12_4_;
  auVar52._0_4_ = auVar22._0_4_ * fVar1 + fVar21 * auVar49._0_4_;
  auVar52._4_4_ = auVar22._4_4_ * fVar7 + fVar29 * auVar49._4_4_;
  auVar52._8_4_ = auVar22._8_4_ * fVar8 + fVar30 * auVar49._8_4_;
  auVar52._12_4_ = auVar22._12_4_ * fVar31 + fVar32 * auVar49._12_4_;
  auVar57._0_4_ = auVar67._0_4_ * fVar1 + fVar21 * auVar35._0_4_;
  auVar57._4_4_ = auVar67._4_4_ * fVar7 + fVar29 * auVar35._4_4_;
  auVar57._8_4_ = auVar67._8_4_ * fVar8 + fVar30 * auVar35._8_4_;
  auVar57._12_4_ = auVar67._12_4_ * fVar31 + fVar32 * auVar35._12_4_;
  auVar49._0_4_ = auVar44._0_4_ * fVar1 + fVar21 * auVar45._0_4_;
  auVar49._4_4_ = auVar44._4_4_ * fVar7 + fVar29 * auVar45._4_4_;
  auVar49._8_4_ = auVar44._8_4_ * fVar8 + fVar30 * auVar45._8_4_;
  auVar49._12_4_ = auVar44._12_4_ * fVar31 + fVar32 * auVar45._12_4_;
  fVar21 = fVar21 * auVar59._0_4_ + fVar1 * auVar42._0_4_;
  fVar29 = fVar29 * auVar59._4_4_ + fVar7 * auVar42._4_4_;
  fVar30 = fVar30 * auVar59._8_4_ + fVar8 * auVar42._8_4_;
  fVar31 = fVar32 * auVar59._12_4_ + fVar31 * auVar42._12_4_;
  auVar43 = vpshufd_avx(ZEXT116(sphere->numPrimitives),0);
  auVar25 = vpcmpgtd_avx(auVar43,_DAT_01f4ad30);
  local_1a0 = vpshufd_avx(ZEXT416(sphere->sharedGeomID),0);
  uVar11 = *(undefined4 *)(ray + k * 4);
  auVar43._4_4_ = uVar11;
  auVar43._0_4_ = uVar11;
  auVar43._8_4_ = uVar11;
  auVar43._12_4_ = uVar11;
  auVar59 = vsubps_avx(auVar52,auVar43);
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar35._4_4_ = uVar11;
  auVar35._0_4_ = uVar11;
  auVar35._8_4_ = uVar11;
  auVar35._12_4_ = uVar11;
  auVar67 = vsubps_avx(auVar57,auVar35);
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar42._4_4_ = uVar11;
  auVar42._0_4_ = uVar11;
  auVar42._8_4_ = uVar11;
  auVar42._12_4_ = uVar11;
  auVar42 = vsubps_avx(auVar49,auVar42);
  fVar1 = *(float *)(ray + k * 4 + 0x80);
  auVar65 = ZEXT1664(CONCAT412(fVar1,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))));
  fVar7 = *(float *)(ray + k * 4 + 0xa0);
  auVar66 = ZEXT1664(CONCAT412(fVar7,CONCAT48(fVar7,CONCAT44(fVar7,fVar7))));
  fVar8 = *(float *)(ray + k * 4 + 0xc0);
  auVar68 = ZEXT1664(CONCAT412(fVar8,CONCAT48(fVar8,CONCAT44(fVar8,fVar8))));
  auVar43 = ZEXT416((uint)(fVar1 * fVar1 + fVar7 * fVar7 + fVar8 * fVar8));
  auVar35 = vshufps_avx(auVar43,auVar43,0);
  auVar43 = vrcpps_avx(auVar35);
  fVar32 = auVar43._0_4_;
  auVar44._0_4_ = fVar32 * auVar35._0_4_;
  fVar39 = auVar43._4_4_;
  auVar44._4_4_ = fVar39 * auVar35._4_4_;
  fVar40 = auVar43._8_4_;
  auVar44._8_4_ = fVar40 * auVar35._8_4_;
  fVar41 = auVar43._12_4_;
  auVar44._12_4_ = fVar41 * auVar35._12_4_;
  auVar43 = vsubps_avx(auVar33,auVar44);
  fVar32 = fVar32 + fVar32 * auVar43._0_4_;
  fVar39 = fVar39 + fVar39 * auVar43._4_4_;
  fVar40 = fVar40 + fVar40 * auVar43._8_4_;
  fVar41 = fVar41 + fVar41 * auVar43._12_4_;
  auVar45._0_4_ = (fVar1 * auVar59._0_4_ + fVar7 * auVar67._0_4_ + fVar8 * auVar42._0_4_) * fVar32;
  auVar45._4_4_ = (fVar1 * auVar59._4_4_ + fVar7 * auVar67._4_4_ + fVar8 * auVar42._4_4_) * fVar39;
  auVar45._8_4_ = (fVar1 * auVar59._8_4_ + fVar7 * auVar67._8_4_ + fVar8 * auVar42._8_4_) * fVar40;
  auVar45._12_4_ =
       (fVar1 * auVar59._12_4_ + fVar7 * auVar67._12_4_ + fVar8 * auVar42._12_4_) * fVar41;
  auVar58._0_4_ = fVar1 * auVar45._0_4_;
  auVar58._4_4_ = fVar1 * auVar45._4_4_;
  auVar58._8_4_ = fVar1 * auVar45._8_4_;
  auVar58._12_4_ = fVar1 * auVar45._12_4_;
  auVar61._0_4_ = fVar7 * auVar45._0_4_;
  auVar61._4_4_ = fVar7 * auVar45._4_4_;
  auVar61._8_4_ = fVar7 * auVar45._8_4_;
  auVar61._12_4_ = fVar7 * auVar45._12_4_;
  auVar63._0_4_ = fVar8 * auVar45._0_4_;
  auVar63._4_4_ = fVar8 * auVar45._4_4_;
  auVar63._8_4_ = fVar8 * auVar45._8_4_;
  auVar63._12_4_ = fVar8 * auVar45._12_4_;
  auVar35 = vsubps_avx(auVar59,auVar58);
  auVar69 = ZEXT1664(auVar35);
  auVar59 = vsubps_avx(auVar67,auVar61);
  auVar62 = ZEXT1664(auVar59);
  auVar67 = vsubps_avx(auVar42,auVar63);
  auVar64 = ZEXT1664(auVar67);
  auVar50._0_4_ =
       auVar35._0_4_ * auVar35._0_4_ + auVar59._0_4_ * auVar59._0_4_ + auVar67._0_4_ * auVar67._0_4_
  ;
  auVar50._4_4_ =
       auVar35._4_4_ * auVar35._4_4_ + auVar59._4_4_ * auVar59._4_4_ + auVar67._4_4_ * auVar67._4_4_
  ;
  auVar50._8_4_ =
       auVar35._8_4_ * auVar35._8_4_ + auVar59._8_4_ * auVar59._8_4_ + auVar67._8_4_ * auVar67._8_4_
  ;
  auVar50._12_4_ =
       auVar35._12_4_ * auVar35._12_4_ +
       auVar59._12_4_ * auVar59._12_4_ + auVar67._12_4_ * auVar67._12_4_;
  auVar22._0_4_ = fVar21 * fVar21;
  auVar22._4_4_ = fVar29 * fVar29;
  auVar22._8_4_ = fVar30 * fVar30;
  auVar22._12_4_ = fVar31 * fVar31;
  auVar43 = vcmpps_avx(auVar50,auVar22,2);
  auVar42 = auVar25 & auVar43;
  if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar42[0xf] < '\0') {
    auVar43 = vandps_avx(auVar43,auVar25);
    auVar25 = vsubps_avx(auVar22,auVar50);
    auVar23._0_4_ = fVar32 * auVar25._0_4_;
    auVar23._4_4_ = fVar39 * auVar25._4_4_;
    auVar23._8_4_ = fVar40 * auVar25._8_4_;
    auVar23._12_4_ = fVar41 * auVar25._12_4_;
    auVar44 = vsqrtps_avx(auVar23);
    auVar70 = ZEXT1664(auVar44);
    auVar49 = vsubps_avx(auVar45,auVar44);
    auVar53._0_4_ = auVar44._0_4_ + auVar45._0_4_;
    auVar53._4_4_ = auVar44._4_4_ + auVar45._4_4_;
    auVar53._8_4_ = auVar44._8_4_ + auVar45._8_4_;
    auVar53._12_4_ = auVar44._12_4_ + auVar45._12_4_;
    auVar54 = ZEXT1664(auVar53);
    uVar11 = *(undefined4 *)(ray + k * 4 + 0x60);
    auVar46._4_4_ = uVar11;
    auVar46._0_4_ = uVar11;
    auVar46._8_4_ = uVar11;
    auVar46._12_4_ = uVar11;
    auVar25 = vcmpps_avx(auVar46,auVar49,2);
    uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar55._4_4_ = uVar11;
    auVar55._0_4_ = uVar11;
    auVar55._8_4_ = uVar11;
    auVar55._12_4_ = uVar11;
    auVar56 = ZEXT1664(auVar55);
    auVar42 = vcmpps_avx(auVar49,auVar55,2);
    local_190 = vandps_avx(auVar42,auVar25);
    auVar25 = vandps_avx(local_190,auVar43);
    auVar42 = vcmpps_avx(auVar46,auVar53,2);
    auVar22 = vcmpps_avx(auVar53,auVar55,2);
    auVar42 = vandps_avx(auVar42,auVar22);
    auVar43 = vandps_avx(auVar42,auVar43);
    auVar51 = ZEXT1664(auVar43);
    local_320 = vorps_avx(auVar25,auVar43);
    if ((((local_320 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (local_320 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (local_320 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        local_320[0xf] < '\0') {
      local_270 = vblendvps_avx(auVar53,auVar49,auVar25);
      auVar24._0_8_ = auVar44._0_8_ ^ 0x8000000080000000;
      auVar24._8_4_ = -auVar44._8_4_;
      auVar24._12_4_ = -auVar44._12_4_;
      auVar43 = vblendvps_avx(auVar44,auVar24,auVar25);
      fVar31 = auVar43._0_4_;
      auVar34._0_4_ = fVar1 * fVar31;
      fVar21 = auVar43._4_4_;
      auVar34._4_4_ = fVar1 * fVar21;
      fVar29 = auVar43._8_4_;
      auVar34._8_4_ = fVar1 * fVar29;
      fVar30 = auVar43._12_4_;
      auVar34._12_4_ = fVar1 * fVar30;
      auVar47._0_4_ = fVar7 * fVar31;
      auVar47._4_4_ = fVar7 * fVar21;
      auVar47._8_4_ = fVar7 * fVar29;
      auVar47._12_4_ = fVar7 * fVar30;
      auVar25._0_4_ = fVar8 * fVar31;
      auVar25._4_4_ = fVar8 * fVar21;
      auVar25._8_4_ = fVar8 * fVar29;
      auVar25._12_4_ = fVar8 * fVar30;
      local_260 = vsubps_avx(auVar34,auVar35);
      local_250 = vsubps_avx(auVar47,auVar59);
      local_240 = vsubps_avx(auVar25,auVar67);
      auVar59._8_4_ = 0x7f800000;
      auVar59._0_8_ = 0x7f8000007f800000;
      auVar59._12_4_ = 0x7f800000;
      auVar60 = ZEXT1664(auVar59);
      local_1b0 = local_270;
      auVar43 = vblendvps_avx(auVar59,local_270,local_320);
      auVar25 = vshufps_avx(auVar43,auVar43,0xb1);
      auVar25 = vminps_avx(auVar25,auVar43);
      auVar35 = vshufpd_avx(auVar25,auVar25,1);
      auVar25 = vminps_avx(auVar35,auVar25);
      auVar25 = vcmpps_avx(auVar43,auVar25,0);
      auVar35 = local_320 & auVar25;
      auVar43 = vpcmpeqd_avx(auVar43,auVar43);
      if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar35[0xf] < '\0'
         ) {
        auVar43 = auVar25;
      }
      auVar43 = vandps_avx(local_320,auVar43);
      uVar9 = vmovmskps_avx(auVar43);
      lVar18 = 0;
      if (uVar9 != 0) {
        for (; (uVar9 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
        }
      }
      uVar9 = 1 << ((byte)k & 0x1f);
      auVar71 = ZEXT864(0) << 0x20;
      local_308 = context;
      do {
        auVar43 = auVar51._0_16_;
        auVar25 = auVar62._0_16_;
        auVar35 = auVar65._0_16_;
        local_280 = &local_180;
        local_2a0 = local_300;
        auVar38 = auVar64._0_32_;
        auVar42 = auVar69._0_16_;
        auVar67 = auVar68._0_16_;
        auVar59 = auVar66._0_16_;
        auVar22 = auVar70._0_16_;
        uVar2 = *(uint *)(local_1a0 + lVar18 * 4);
        pRVar12 = (RayHitK<8> *)(ulong)uVar2;
        pGVar4 = (pSVar3->geometries).items[(long)pRVar12].ptr;
        local_288 = ray;
        if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          *(undefined4 *)(local_320 + lVar18 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            auVar56 = ZEXT464(*(uint *)(local_270 + lVar18 * 4));
            *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_270 + lVar18 * 4);
            *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_260 + lVar18 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_250 + lVar18 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_240 + lVar18 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1e0) = 0;
            *(undefined4 *)(ray + k * 4 + 0x200) = 0;
            *(uint *)(ray + k * 4 + 0x220) = (sphere->primIDs).field_0.i[lVar18];
            *(uint *)(ray + k * 4 + 0x240) = uVar2;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            uVar11 = 0;
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
LAB_00872fb6:
            auVar44 = vshufps_avx(auVar56._0_16_,auVar56._0_16_,0);
            local_270 = auVar54._0_16_;
            auVar44 = vcmpps_avx(local_270,auVar44,2);
            auVar44 = vandps_avx(auVar44,local_190);
            auVar45 = auVar43 & auVar44;
            if ((((auVar45 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar45 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar45 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar45[0xf]) {
              return;
            }
            local_320 = vandps_avx(auVar44,auVar43);
            fVar1 = auVar22._0_4_;
            auVar26._0_4_ = auVar35._0_4_ * fVar1;
            fVar7 = auVar22._4_4_;
            auVar26._4_4_ = auVar35._4_4_ * fVar7;
            fVar8 = auVar22._8_4_;
            auVar26._8_4_ = auVar35._8_4_ * fVar8;
            fVar31 = auVar22._12_4_;
            auVar26._12_4_ = auVar35._12_4_ * fVar31;
            auVar36._0_4_ = auVar59._0_4_ * fVar1;
            auVar36._4_4_ = auVar59._4_4_ * fVar7;
            auVar36._8_4_ = auVar59._8_4_ * fVar8;
            auVar36._12_4_ = auVar59._12_4_ * fVar31;
            auVar48._0_4_ = auVar67._0_4_ * fVar1;
            auVar48._4_4_ = auVar67._4_4_ * fVar7;
            auVar48._8_4_ = auVar67._8_4_ * fVar8;
            auVar48._12_4_ = auVar67._12_4_ * fVar31;
            local_260 = vsubps_avx(auVar26,auVar42);
            local_250 = vsubps_avx(auVar36,auVar25);
            local_240 = vsubps_avx(auVar48,auVar38._0_16_);
            pSVar3 = context->scene;
            auVar43 = vblendvps_avx(auVar60._0_16_,local_270,local_320);
            auVar25 = vshufps_avx(auVar43,auVar43,0xb1);
            auVar25 = vminps_avx(auVar25,auVar43);
            auVar35 = vshufpd_avx(auVar25,auVar25,1);
            auVar25 = vminps_avx(auVar35,auVar25);
            auVar25 = vcmpps_avx(auVar43,auVar25,0);
            auVar35 = local_320 & auVar25;
            auVar43 = local_320;
            if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar35[0xf] < '\0') {
              auVar43 = vandps_avx(auVar25,local_320);
            }
            uVar10 = vmovmskps_avx(auVar43);
            lVar18 = 0;
            if (CONCAT44(uVar11,uVar10) != 0) {
              for (; (CONCAT44(uVar11,uVar10) >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
              }
            }
            auVar38 = vcmpps_avx(auVar38,auVar38,0xf);
            auVar62 = ZEXT3264(auVar38);
            auVar64 = ZEXT1664(ZEXT816(0) << 0x40);
            do {
              local_280 = &local_180;
              local_2a0 = local_300;
              uVar2 = *(uint *)(local_1a0 + lVar18 * 4);
              pRVar12 = (RayHitK<8> *)(ulong)uVar2;
              pGVar4 = (pSVar3->geometries).items[(long)pRVar12].ptr;
              if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_320 + lVar18 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_270 + lVar18 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_260 + lVar18 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_250 + lVar18 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_240 + lVar18 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = 0;
                  *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                  *(uint *)(ray + k * 4 + 0x220) = (sphere->primIDs).field_0.i[lVar18];
                  *(uint *)(ray + k * 4 + 0x240) = uVar2;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  return;
                }
                auStack_b0 = vpshufd_avx(ZEXT416(uVar2),0);
                local_e0 = (sphere->primIDs).field_0.i[lVar18];
                local_180._0_4_ = *(undefined4 *)(local_260 + lVar18 * 4);
                local_160 = *(undefined4 *)(local_250 + lVar18 * 4);
                uVar11 = *(undefined4 *)(local_240 + lVar18 * 4);
                local_140._4_4_ = uVar11;
                local_140._0_4_ = uVar11;
                local_140._8_4_ = uVar11;
                local_140._12_4_ = uVar11;
                local_140._16_4_ = uVar11;
                local_140._20_4_ = uVar11;
                local_140._24_4_ = uVar11;
                local_140._28_4_ = uVar11;
                local_180._4_4_ = local_180._0_4_;
                local_180._8_4_ = local_180._0_4_;
                local_180._12_4_ = local_180._0_4_;
                local_180._16_4_ = local_180._0_4_;
                local_180._20_4_ = local_180._0_4_;
                local_180._24_4_ = local_180._0_4_;
                local_180._28_4_ = local_180._0_4_;
                uStack_15c = local_160;
                uStack_158 = local_160;
                uStack_154 = local_160;
                uStack_150 = local_160;
                uStack_14c = local_160;
                uStack_148 = local_160;
                uStack_144 = local_160;
                local_100 = ZEXT1632(ZEXT816(0));
                local_120 = ZEXT1632(ZEXT816(0));
                uStack_dc = local_e0;
                uStack_d8 = local_e0;
                uStack_d4 = local_e0;
                uStack_d0 = local_e0;
                uStack_cc = local_e0;
                uStack_c8 = local_e0;
                uStack_c4 = local_e0;
                local_c0 = auStack_b0;
                uStack_9c = context->user->instID[0];
                local_a0 = uStack_9c;
                uStack_98 = uStack_9c;
                uStack_94 = uStack_9c;
                uStack_90 = uStack_9c;
                uStack_8c = uStack_9c;
                uStack_88 = uStack_9c;
                uStack_84 = uStack_9c;
                uStack_7c = context->user->instPrimID[0];
                local_80 = uStack_7c;
                uStack_78 = uStack_7c;
                uStack_74 = uStack_7c;
                uStack_70 = uStack_7c;
                uStack_6c = uStack_7c;
                uStack_68 = uStack_7c;
                uStack_64 = uStack_7c;
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_270 + lVar18 * 4);
                local_300 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar9 & 0xf) << 4));
                local_2f0 = *(undefined1 (*) [16])
                             (mm_lookupmask_ps + (long)((int)uVar9 >> 4) * 0x10);
                local_298 = pGVar4->userPtr;
                local_290 = context->user;
                local_278 = 8;
                pRVar12 = (RayHitK<8> *)pGVar4->intersectionFilterN;
                local_288 = ray;
                if (pRVar12 != (RayHitK<8> *)0x0) {
                  local_2c0 = auVar54._0_16_;
                  local_2d0 = auVar56._0_16_;
                  auVar38 = ZEXT1632(auVar62._0_16_);
                  local_2a8 = sphere;
                  pRVar12 = (RayHitK<8> *)(*(code *)pRVar12)(&local_2a0);
                  auVar64 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar38 = vcmpps_avx(auVar38,auVar38,0xf);
                  auVar62 = ZEXT3264(auVar38);
                  auVar56 = ZEXT1664(local_2d0);
                  auVar54 = ZEXT1664(local_2c0);
                  context = local_308;
                  sphere = local_2a8;
                }
                auVar43 = vpcmpeqd_avx(auVar64._0_16_,local_300);
                auVar25 = vpcmpeqd_avx(auVar64._0_16_,local_2f0);
                auVar38._16_16_ = auVar25;
                auVar38._0_16_ = auVar43;
                auVar38 = auVar62._0_32_ & ~auVar38;
                if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar38 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar38 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar38 >> 0x7f,0) == '\0') &&
                      (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar38 >> 0xbf,0) == '\0') &&
                    (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar38[0x1f]) {
                  auVar20._0_4_ = auVar62._0_4_ ^ auVar43._0_4_;
                  auVar20._4_4_ = auVar62._4_4_ ^ auVar43._4_4_;
                  auVar20._8_4_ = auVar62._8_4_ ^ auVar43._8_4_;
                  auVar20._12_4_ = auVar62._12_4_ ^ auVar43._12_4_;
                  auVar20._16_4_ = auVar62._16_4_ ^ auVar25._0_4_;
                  auVar20._20_4_ = auVar62._20_4_ ^ auVar25._4_4_;
                  auVar20._24_4_ = auVar62._24_4_ ^ auVar25._8_4_;
                  auVar20._28_4_ = auVar62._28_4_ ^ auVar25._12_4_;
                  auVar60 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                }
                else {
                  pRVar12 = (RayHitK<8> *)context->args->filter;
                  if ((pRVar12 != (RayHitK<8> *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    local_2c0 = auVar54._0_16_;
                    local_2d0 = auVar56._0_16_;
                    auVar38 = ZEXT1632(auVar62._0_16_);
                    pRVar12 = (RayHitK<8> *)(*(code *)pRVar12)(&local_2a0);
                    auVar64 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar38 = vcmpps_avx(auVar38,auVar38,0xf);
                    auVar62 = ZEXT3264(auVar38);
                    auVar56 = ZEXT1664(local_2d0);
                    auVar54 = ZEXT1664(local_2c0);
                    context = local_308;
                  }
                  auVar43 = vpcmpeqd_avx(auVar64._0_16_,local_300);
                  auVar25 = vpcmpeqd_avx(auVar64._0_16_,local_2f0);
                  auVar28._16_16_ = auVar25;
                  auVar28._0_16_ = auVar43;
                  auVar20._0_4_ = auVar62._0_4_ ^ auVar43._0_4_;
                  auVar20._4_4_ = auVar62._4_4_ ^ auVar43._4_4_;
                  auVar20._8_4_ = auVar62._8_4_ ^ auVar43._8_4_;
                  auVar20._12_4_ = auVar62._12_4_ ^ auVar43._12_4_;
                  auVar20._16_4_ = auVar62._16_4_ ^ auVar25._0_4_;
                  auVar20._20_4_ = auVar62._20_4_ ^ auVar25._4_4_;
                  auVar20._24_4_ = auVar62._24_4_ ^ auVar25._8_4_;
                  auVar20._28_4_ = auVar62._28_4_ ^ auVar25._12_4_;
                  auVar38 = auVar62._0_32_ & ~auVar28;
                  auVar60 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                  if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar38 >> 0x7f,0) != '\0') ||
                        (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar38 >> 0xbf,0) != '\0') ||
                      (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar38[0x1f] < '\0') {
                    auVar38 = vmaskmovps_avx(auVar20,*local_280);
                    *(undefined1 (*) [32])(local_288 + 0x180) = auVar38;
                    auVar38 = vmaskmovps_avx(auVar20,local_280[1]);
                    *(undefined1 (*) [32])(local_288 + 0x1a0) = auVar38;
                    auVar38 = vmaskmovps_avx(auVar20,local_280[2]);
                    *(undefined1 (*) [32])(local_288 + 0x1c0) = auVar38;
                    auVar38 = vmaskmovps_avx(auVar20,local_280[3]);
                    *(undefined1 (*) [32])(local_288 + 0x1e0) = auVar38;
                    auVar38 = vmaskmovps_avx(auVar20,local_280[4]);
                    *(undefined1 (*) [32])(local_288 + 0x200) = auVar38;
                    auVar38 = vmaskmovps_avx(auVar20,local_280[5]);
                    *(undefined1 (*) [32])(local_288 + 0x220) = auVar38;
                    auVar38 = vmaskmovps_avx(auVar20,local_280[6]);
                    *(undefined1 (*) [32])(local_288 + 0x240) = auVar38;
                    auVar38 = vmaskmovps_avx(auVar20,local_280[7]);
                    *(undefined1 (*) [32])(local_288 + 0x260) = auVar38;
                    auVar38 = vmaskmovps_avx(auVar20,local_280[8]);
                    *(undefined1 (*) [32])(local_288 + 0x280) = auVar38;
                    pRVar12 = local_288;
                  }
                }
                if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar20 >> 0x7f,0) == '\0') &&
                      (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar20 >> 0xbf,0) == '\0') &&
                    (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar20[0x1f]) {
                  *(int *)(ray + k * 4 + 0x100) = auVar56._0_4_;
                }
                else {
                  auVar56 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                }
                *(undefined4 *)(local_320 + lVar18 * 4) = 0;
                auVar43 = vshufps_avx(auVar56._0_16_,auVar56._0_16_,0);
                auVar43 = vcmpps_avx(auVar54._0_16_,auVar43,2);
                local_320 = vandps_avx(auVar43,local_320);
              }
              if ((((local_320 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_320 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_320 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_320[0xf]) {
                return;
              }
              auVar43 = vblendvps_avx(auVar60._0_16_,auVar54._0_16_,local_320);
              auVar25 = vshufps_avx(auVar43,auVar43,0xb1);
              auVar25 = vminps_avx(auVar25,auVar43);
              auVar35 = vshufpd_avx(auVar25,auVar25,1);
              auVar25 = vminps_avx(auVar35,auVar25);
              auVar25 = vcmpps_avx(auVar43,auVar25,0);
              auVar35 = local_320 & auVar25;
              auVar43 = local_320;
              if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar35[0xf] < '\0') {
                auVar43 = vandps_avx(auVar25,local_320);
              }
              uVar11 = vmovmskps_avx(auVar43);
              uVar13 = CONCAT44((int)((ulong)pRVar12 >> 0x20),uVar11);
              lVar18 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
                }
              }
            } while( true );
          }
          local_1c0 = auVar43;
          auStack_b0 = vpshufd_avx(ZEXT416(uVar2),0);
          local_e0 = (sphere->primIDs).field_0.i[lVar18];
          local_180._0_4_ = *(undefined4 *)(local_260 + lVar18 * 4);
          local_160 = *(undefined4 *)(local_250 + lVar18 * 4);
          uVar11 = *(undefined4 *)(local_240 + lVar18 * 4);
          local_140._4_4_ = uVar11;
          local_140._0_4_ = uVar11;
          local_140._8_4_ = uVar11;
          local_140._12_4_ = uVar11;
          local_140._16_4_ = uVar11;
          local_140._20_4_ = uVar11;
          local_140._24_4_ = uVar11;
          local_140._28_4_ = uVar11;
          local_180._4_4_ = local_180._0_4_;
          local_180._8_4_ = local_180._0_4_;
          local_180._12_4_ = local_180._0_4_;
          local_180._16_4_ = local_180._0_4_;
          local_180._20_4_ = local_180._0_4_;
          local_180._24_4_ = local_180._0_4_;
          local_180._28_4_ = local_180._0_4_;
          uStack_15c = local_160;
          uStack_158 = local_160;
          uStack_154 = local_160;
          uStack_150 = local_160;
          uStack_14c = local_160;
          uStack_148 = local_160;
          uStack_144 = local_160;
          local_100 = auVar71._0_32_;
          local_120 = auVar71._0_32_;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          local_c0 = auStack_b0;
          auVar38 = vcmpps_avx(local_140,local_140,0xf);
          uStack_9c = context->user->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = context->user->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_270 + lVar18 * 4);
          local_300 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar9 & 0xf) << 4));
          local_2f0 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar9 >> 4) * 0x10);
          local_298 = pGVar4->userPtr;
          local_290 = context->user;
          local_278 = 8;
          pRVar12 = (RayHitK<8> *)pGVar4->intersectionFilterN;
          if (pRVar12 != (RayHitK<8> *)0x0) {
            local_2c0 = auVar54._0_16_;
            local_2d0 = auVar56._0_16_;
            local_220 = auVar64._0_16_;
            auVar38 = ZEXT1632(auVar38._0_16_);
            local_2a8 = sphere;
            local_230 = auVar22;
            local_210 = auVar25;
            local_200 = auVar42;
            local_1f0 = auVar67;
            local_1e0 = auVar59;
            local_1d0 = auVar35;
            pRVar12 = (RayHitK<8> *)(*(code *)pRVar12)(&local_2a0);
            auVar38 = vcmpps_avx(auVar38,auVar38,0xf);
            auVar71 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar70 = ZEXT1664(local_230);
            auVar64 = ZEXT1664(local_220);
            auVar62 = ZEXT1664(local_210);
            auVar69 = ZEXT1664(local_200);
            auVar68 = ZEXT1664(local_1f0);
            auVar66 = ZEXT1664(local_1e0);
            auVar65 = ZEXT1664(local_1d0);
            auVar60 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            auVar56 = ZEXT1664(local_2d0);
            auVar54 = ZEXT1664(local_2c0);
            context = local_308;
            sphere = local_2a8;
          }
          auVar43 = vpcmpeqd_avx(local_300,ZEXT816(0) << 0x40);
          auVar25 = vpcmpeqd_avx(local_2f0,ZEXT816(0) << 0x40);
          auVar37._16_16_ = auVar25;
          auVar37._0_16_ = auVar43;
          auVar37 = auVar38 & ~auVar37;
          if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar37 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar37 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar37 >> 0x7f,0) == '\0') &&
                (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar37 >> 0xbf,0) == '\0') &&
              (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar37[0x1f]) {
            auVar19._0_4_ = auVar43._0_4_ ^ auVar38._0_4_;
            auVar19._4_4_ = auVar43._4_4_ ^ auVar38._4_4_;
            auVar19._8_4_ = auVar43._8_4_ ^ auVar38._8_4_;
            auVar19._12_4_ = auVar43._12_4_ ^ auVar38._12_4_;
            auVar19._16_4_ = auVar25._0_4_ ^ auVar38._16_4_;
            auVar19._20_4_ = auVar25._4_4_ ^ auVar38._20_4_;
            auVar19._24_4_ = auVar25._8_4_ ^ auVar38._24_4_;
            auVar19._28_4_ = auVar25._12_4_ ^ auVar38._28_4_;
            auVar51 = ZEXT1664(local_1c0);
          }
          else {
            pRVar12 = (RayHitK<8> *)context->args->filter;
            auVar51 = ZEXT1664(local_1c0);
            if ((pRVar12 != (RayHitK<8> *)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
              local_2c0 = auVar54._0_16_;
              local_2d0 = auVar56._0_16_;
              local_1d0 = auVar65._0_16_;
              local_1e0 = auVar66._0_16_;
              local_1f0 = auVar68._0_16_;
              local_200 = auVar69._0_16_;
              local_210 = auVar62._0_16_;
              local_220 = auVar64._0_16_;
              local_230 = auVar70._0_16_;
              pRVar12 = (RayHitK<8> *)(*(code *)pRVar12)(&local_2a0);
              auVar71 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar51 = ZEXT1664(local_1c0);
              auVar70 = ZEXT1664(local_230);
              auVar64 = ZEXT1664(local_220);
              auVar62 = ZEXT1664(local_210);
              auVar69 = ZEXT1664(local_200);
              auVar68 = ZEXT1664(local_1f0);
              auVar66 = ZEXT1664(local_1e0);
              auVar65 = ZEXT1664(local_1d0);
              auVar60 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar56 = ZEXT1664(local_2d0);
              auVar54 = ZEXT1664(local_2c0);
              context = local_308;
            }
            auVar35 = ZEXT816(0) << 0x40;
            auVar43 = vpcmpeqd_avx(local_300,auVar35);
            auVar25 = vpcmpeqd_avx(local_2f0,auVar35);
            auVar27._16_16_ = auVar25;
            auVar27._0_16_ = auVar43;
            auVar38 = vcmpps_avx(ZEXT1632(auVar35),ZEXT1632(auVar35),0xf);
            auVar19._0_4_ = auVar43._0_4_ ^ auVar38._0_4_;
            auVar19._4_4_ = auVar43._4_4_ ^ auVar38._4_4_;
            auVar19._8_4_ = auVar43._8_4_ ^ auVar38._8_4_;
            auVar19._12_4_ = auVar43._12_4_ ^ auVar38._12_4_;
            auVar19._16_4_ = auVar25._0_4_ ^ auVar38._16_4_;
            auVar19._20_4_ = auVar25._4_4_ ^ auVar38._20_4_;
            auVar19._24_4_ = auVar25._8_4_ ^ auVar38._24_4_;
            auVar19._28_4_ = auVar25._12_4_ ^ auVar38._28_4_;
            auVar38 = auVar38 & ~auVar27;
            if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar38 >> 0x7f,0) != '\0') ||
                  (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar38 >> 0xbf,0) != '\0') ||
                (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar38[0x1f] < '\0') {
              auVar38 = vmaskmovps_avx(auVar19,*local_280);
              *(undefined1 (*) [32])(local_288 + 0x180) = auVar38;
              auVar38 = vmaskmovps_avx(auVar19,local_280[1]);
              *(undefined1 (*) [32])(local_288 + 0x1a0) = auVar38;
              auVar38 = vmaskmovps_avx(auVar19,local_280[2]);
              *(undefined1 (*) [32])(local_288 + 0x1c0) = auVar38;
              auVar38 = vmaskmovps_avx(auVar19,local_280[3]);
              *(undefined1 (*) [32])(local_288 + 0x1e0) = auVar38;
              auVar38 = vmaskmovps_avx(auVar19,local_280[4]);
              *(undefined1 (*) [32])(local_288 + 0x200) = auVar38;
              auVar38 = vmaskmovps_avx(auVar19,local_280[5]);
              *(undefined1 (*) [32])(local_288 + 0x220) = auVar38;
              auVar38 = vmaskmovps_avx(auVar19,local_280[6]);
              *(undefined1 (*) [32])(local_288 + 0x240) = auVar38;
              auVar38 = vmaskmovps_avx(auVar19,local_280[7]);
              *(undefined1 (*) [32])(local_288 + 0x260) = auVar38;
              auVar38 = vmaskmovps_avx(auVar19,local_280[8]);
              *(undefined1 (*) [32])(local_288 + 0x280) = auVar38;
              pRVar12 = local_288;
            }
          }
          if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar19 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar19 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar19 >> 0x7f,0) == '\0') &&
                (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar19 >> 0xbf,0) == '\0') &&
              (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar19[0x1f]) {
            *(int *)(ray + k * 4 + 0x100) = auVar56._0_4_;
          }
          else {
            auVar56 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
          }
          *(undefined4 *)(local_320 + lVar18 * 4) = 0;
          auVar43 = vshufps_avx(auVar56._0_16_,auVar56._0_16_,0);
          auVar43 = vcmpps_avx(local_1b0,auVar43,2);
          local_320 = vandps_avx(auVar43,local_320);
        }
        uVar11 = (undefined4)((ulong)pRVar12 >> 0x20);
        auVar43 = auVar51._0_16_;
        auVar25 = auVar62._0_16_;
        auVar35 = auVar65._0_16_;
        auVar38 = auVar64._0_32_;
        auVar42 = auVar69._0_16_;
        auVar67 = auVar68._0_16_;
        auVar59 = auVar66._0_16_;
        auVar22 = auVar70._0_16_;
        if ((((local_320 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (local_320 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (local_320 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            -1 < local_320[0xf]) goto LAB_00872fb6;
        auVar43 = vblendvps_avx(auVar60._0_16_,local_1b0,local_320);
        auVar25 = vshufps_avx(auVar43,auVar43,0xb1);
        auVar25 = vminps_avx(auVar25,auVar43);
        auVar35 = vshufpd_avx(auVar25,auVar25,1);
        auVar25 = vminps_avx(auVar35,auVar25);
        auVar25 = vcmpps_avx(auVar43,auVar25,0);
        auVar35 = local_320 & auVar25;
        auVar43 = local_320;
        if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar35[0xf] < '\0') {
          auVar43 = vandps_avx(auVar25,local_320);
        }
        uVar10 = vmovmskps_avx(auVar43);
        lVar18 = 0;
        if (CONCAT44(uVar11,uVar10) != 0) {
          for (; (CONCAT44(uVar11,uVar10) >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom, ray.time()[k]);
        const vbool<M> valid = sphere.valid();
        SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Intersect1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }